

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureViewTests.cpp
# Opt level: O3

void __thiscall
gl4cts::TextureViewTestViewSampling::resetReferenceColorStorage
          (TextureViewTestViewSampling *this,uint n_layers,uint n_faces,uint n_mipmaps,
          uint n_samples)

{
  _reference_color_storage *p_Var1;
  Vec4 *pVVar2;
  uint uVar3;
  ulong uVar4;
  
  p_Var1 = this->m_reference_color_storage;
  if (p_Var1 == (_reference_color_storage *)0x0) {
    p_Var1 = (_reference_color_storage *)operator_new(0x18);
    p_Var1->n_faces = n_faces;
    p_Var1->n_layers = n_layers;
    p_Var1->n_mipmaps = n_mipmaps;
    p_Var1->n_samples = n_samples;
    uVar3 = n_mipmaps * n_samples * n_faces * n_layers;
    uVar4 = (ulong)uVar3 << 4;
    pVVar2 = (Vec4 *)operator_new__(uVar4);
    if (uVar3 != 0) {
      memset(pVVar2,0,uVar4);
    }
    p_Var1->data = pVVar2;
    this->m_reference_color_storage = p_Var1;
  }
  else {
    p_Var1->n_faces = n_faces;
    p_Var1->n_layers = n_layers;
    p_Var1->n_mipmaps = n_mipmaps;
    p_Var1->n_samples = n_samples;
    pVVar2 = p_Var1->data;
    if (pVVar2 == (Vec4 *)0x0) goto LAB_00a27c26;
  }
  operator_delete__(pVVar2);
  p_Var1 = this->m_reference_color_storage;
  p_Var1->data = (Vec4 *)0x0;
LAB_00a27c26:
  uVar3 = n_mipmaps * n_samples * n_faces * n_layers;
  uVar4 = (ulong)uVar3 << 4;
  pVVar2 = (Vec4 *)operator_new__(uVar4);
  if (uVar3 != 0) {
    memset(pVVar2,0,uVar4);
  }
  p_Var1->data = pVVar2;
  return;
}

Assistant:

void TextureViewTestViewSampling::resetReferenceColorStorage(unsigned int n_layers, unsigned int n_faces,
															 unsigned int n_mipmaps, unsigned int n_samples)
{
	/* Sanity checks */
	DE_ASSERT(n_layers >= 1);
	DE_ASSERT(n_faces >= 1);
	DE_ASSERT(n_mipmaps >= 1);
	DE_ASSERT(n_samples >= 1);

	/* Allocate the descriptor if it's the first time the test will be
	 * attempting to access it */
	if (m_reference_color_storage == DE_NULL)
	{
		m_reference_color_storage = new _reference_color_storage(n_faces, n_layers, n_mipmaps, n_samples);
	}
	else
	{
		/* The descriptor's already there so we only need to update the properties */
		m_reference_color_storage->n_faces   = n_faces;
		m_reference_color_storage->n_layers  = n_layers;
		m_reference_color_storage->n_mipmaps = n_mipmaps;
		m_reference_color_storage->n_samples = n_samples;
	}

	/* If there's any data descriptor found allocated at this point,
	 * release it */
	if (m_reference_color_storage->data != DE_NULL)
	{
		delete[] m_reference_color_storage->data;

		m_reference_color_storage->data = DE_NULL;
	}

	m_reference_color_storage->data = new tcu::Vec4[n_layers * n_faces * n_mipmaps * n_samples];
}